

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  AccessMode AVar1;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  _func_int *p_Var2;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  Operation *pOVar3;
  Buffer *this_00;
  Buffer *in_stack_ffffffffffffff68;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *this_01;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  local_78;
  VkBufferCreateInfo local_68;
  
  pOVar3 = (Operation *)operator_new(0x30);
  AVar1 = this->m_mode;
  pOVar3->_vptr_Operation = (_func_int **)&PTR__Implementation_00c0a540;
  pOVar3[1]._vptr_Operation = (_func_int **)context;
  pOVar3[2]._vptr_Operation = (_func_int **)resource;
  *(AccessMode *)&pOVar3[3]._vptr_Operation = AVar1;
  pOVar3[4]._vptr_Operation = (_func_int **)0x0;
  this_01 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)(pOVar3 + 4);
  vk = context->m_vk;
  device = context->m_device;
  allocator = context->m_allocator;
  this_00 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,(resource->m_bufferData).size,(AVar1 == ACCESS_MODE_READ) + 1);
  synchronization::Buffer::Buffer(this_00,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  local_78.m_data.ptr = (Buffer *)0x0;
  data._8_8_ = this_01;
  data.ptr = in_stack_ffffffffffffff68;
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  assignData(this_01,data);
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase(&local_78);
  p_Var2 = pOVar3[4]._vptr_Operation[4];
  if (*(int *)&pOVar3[3]._vptr_Operation == 0) {
    memset(*(void **)(p_Var2 + 0x18),0,(size_t)pOVar3[2]._vptr_Operation[5]);
  }
  else {
    fillPattern(*(void **)(p_Var2 + 0x18),(VkDeviceSize)pOVar3[2]._vptr_Operation[5]);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
             (VkDeviceSize)pOVar3[2]._vptr_Operation[5]);
  (__return_storage_ptr__->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar3;
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource, m_mode));
	}